

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadsusp.cpp
# Opt level: O1

PAL_ERROR __thiscall
CorUnix::CThreadSuspensionInfo::InternalResumeThreadFromData
          (CThreadSuspensionInfo *this,CPalThread *pthrResumer,CPalThread *pthrTarget,
          DWORD *pdwSuspendCount)

{
  uint uVar1;
  bool bVar2;
  FILE *__stream;
  PAL_ERROR PVar3;
  ssize_t sVar4;
  int *piVar5;
  uint *puVar6;
  char *pcVar7;
  int iVar8;
  CThreadSuspensionInfo *this_00;
  CThreadSuspensionInfo *this_01;
  
  if (pthrTarget->m_eThreadType == SignalHandlerThread) {
    bVar2 = false;
    fprintf(_stderr,"] %s %s:%d","InternalResumeThreadFromData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
            ,0xf7);
    fprintf(_stderr,
            "Attempting to resume the signal handling thread, which can never be suspended.\n");
    PVar3 = 6;
    goto LAB_001e3b9b;
  }
  AcquireSuspensionLocks(this,pthrResumer,pthrTarget);
  this_01 = (CThreadSuspensionInfo *)&pthrTarget->synchronizationInfo;
  if ((pthrTarget->synchronizationInfo).m_tsThreadState == TS_DONE) {
LAB_001e3a05:
    CThreadSynchronizationInfo::ReleaseNativeWaitLock((CThreadSynchronizationInfo *)this_01);
    ReleaseSuspensionLock(this_01,pthrTarget);
    ReleaseSuspensionLock(this_01,pthrResumer);
    PVar3 = 6;
  }
  else {
    if ((pthrTarget->m_fIsDummy != false) && ((pthrTarget->suspensionInfo).m_nBlockingPipe == -1)) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_001e3aac;
      goto LAB_001e3a05;
    }
    if ((pthrTarget->suspensionInfo).m_nBlockingPipe != -1) {
      do {
        uVar1 = (pthrTarget->suspensionInfo).m_nBlockingPipe;
        this_00 = (CThreadSuspensionInfo *)(ulong)uVar1;
        sVar4 = write(uVar1,"*N7CorUnix21CThreadSuspensionInfoE",1);
        iVar8 = (int)sVar4;
        if (iVar8 == 1) {
          (pthrTarget->suspensionInfo).m_nBlockingPipe = -1;
          CThreadSynchronizationInfo::ReleaseNativeWaitLock((CThreadSynchronizationInfo *)this_01);
          ReleaseSuspensionLock(this_01,pthrTarget);
          ReleaseSuspensionLock(this_01,pthrResumer);
          PVar3 = 0;
          bVar2 = true;
          goto LAB_001e3b9b;
        }
        if ((iVar8 == -1) && (piVar5 = __errno_location(), *piVar5 == 0x20)) {
          ReleaseSuspensionLocks(this_00,pthrResumer,pthrTarget);
          if (PAL_InitializeChakraCoreCalled != false) {
            PVar3 = 6;
            bVar2 = false;
            goto LAB_001e3b9b;
          }
          break;
        }
        if ((iVar8 != 0) && ((iVar8 != -1 || (piVar5 = __errno_location(), *piVar5 != 4)))) {
          CThreadSynchronizationInfo::ReleaseNativeWaitLock((CThreadSynchronizationInfo *)this_01);
          ReleaseSuspensionLock(this_01,pthrTarget);
          ReleaseSuspensionLock(this_01,pthrResumer);
          bVar2 = false;
          fprintf(_stderr,"] %s %s:%d","InternalResumeThreadFromData",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/threadsusp.cpp"
                  ,0x133);
          __stream = _stderr;
          puVar6 = (uint *)__errno_location();
          uVar1 = *puVar6;
          pcVar7 = strerror(uVar1);
          fprintf(__stream,"Write() failed; error is %d (%s)\n",(ulong)uVar1,pcVar7);
          PVar3 = 0x54f;
          goto LAB_001e3b9b;
        }
      } while (PAL_InitializeChakraCoreCalled != false);
LAB_001e3aac:
      abort();
    }
    *pdwSuspendCount = 0;
    PVar3 = 0x16;
  }
  bVar2 = false;
LAB_001e3b9b:
  if (bVar2) {
    *pdwSuspendCount = 1;
  }
  return PVar3;
}

Assistant:

PAL_ERROR
CThreadSuspensionInfo::InternalResumeThreadFromData(
    CPalThread *pthrResumer,
    CPalThread *pthrTarget,
    DWORD *pdwSuspendCount
    )
{
    PAL_ERROR palError = NO_ERROR;

    int nWrittenBytes = -1;

    if (SignalHandlerThread == pthrTarget->GetThreadType())
    {
        ASSERT("Attempting to resume the signal handling thread, which can never be suspended.\n");
        palError = ERROR_INVALID_HANDLE;
        goto InternalResumeThreadFromDataExit;
    }

    // Acquire suspension mutex
    AcquireSuspensionLocks(pthrResumer, pthrTarget);

    // Check target thread's state to ensure it hasn't died.
    // Setting a thread's state to TS_DONE is protected by the
    // target's suspension mutex.
    if (pthrTarget->synchronizationInfo.GetThreadState() == TS_DONE)
    {
        palError = ERROR_INVALID_HANDLE;
        ReleaseSuspensionLocks(pthrResumer, pthrTarget);
        goto InternalResumeThreadFromDataExit;
    }

    // If this is a dummy thread, then it represents a process that was created with CREATE_SUSPENDED
    // and it should have a blocking pipe set. If GetBlockingPipe returns -1 for a dummy thread, then
    // something is wrong - either CREATE_SUSPENDED wasn't used or the process was already resumed.
    if (pthrTarget->IsDummy() && -1 == pthrTarget->suspensionInfo.GetBlockingPipe())
    {
        palError = ERROR_INVALID_HANDLE;
        ERROR("Tried to wake up dummy thread without a blocking pipe.\n");
        ReleaseSuspensionLocks(pthrResumer, pthrTarget);
        goto InternalResumeThreadFromDataExit;
    }

    // If there is a blocking pipe on this thread, resume it by writing the wake up code to that pipe.
    if (-1 != pthrTarget->suspensionInfo.GetBlockingPipe())
    {
        // If write() is interrupted by a signal before writing data,
        // it returns -1 and sets errno to EINTR. In this case, we
        // attempt the write() again.
        writeAgain:
        nWrittenBytes = write(pthrTarget->suspensionInfo.GetBlockingPipe(), &WAKEUPCODE, sizeof(WAKEUPCODE));

        // The size of WAKEUPCODE is 1 byte. If write returns 0, we'll treat it as an error.
        if (sizeof(WAKEUPCODE) != nWrittenBytes)
        {
            // If we are here during process creation, this is most likely caused by the target
            // process dying before reaching this point and thus breaking the pipe.
            if (nWrittenBytes == -1 && EPIPE == errno)
            {
                palError = ERROR_INVALID_HANDLE;
                ReleaseSuspensionLocks(pthrResumer, pthrTarget);
                ERROR("Write failed with EPIPE\n");
                goto InternalResumeThreadFromDataExit;
            }
            else if (nWrittenBytes == 0 || (nWrittenBytes == -1 && EINTR == errno))
            {
                TRACE("write() failed with EINTR; re-attempting write\n");
                goto writeAgain;
            }
            else
            {
                // Some other error occurred; need to release suspension mutexes before leaving ResumeThread.
                palError = ERROR_INTERNAL_ERROR;
                ReleaseSuspensionLocks(pthrResumer, pthrTarget);
                ASSERT("Write() failed; error is %d (%s)\n", errno, strerror(errno));
                goto InternalResumeThreadFromDataExit;
            }
        }

        // Reset blocking pipe to -1 since we're done using it.
        pthrTarget->suspensionInfo.SetBlockingPipe(-1);

        ReleaseSuspensionLocks(pthrResumer, pthrTarget);
        goto InternalResumeThreadFromDataExit;
    }
    else
    {
        *pdwSuspendCount = 0;
        palError = ERROR_BAD_COMMAND;
    }

InternalResumeThreadFromDataExit:

    if (NO_ERROR == palError)
    {
        *pdwSuspendCount = 1;
    }

    return palError;
}